

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O0

int fy_save_simple_key_mark
              (fy_parser *fyp,fy_simple_key_mark *fyskm,fy_token_type next_type,fy_mark *end_markp)

{
  undefined8 end_mark_00;
  int iVar1;
  fy_token *fyt;
  undefined1 local_38 [8];
  fy_mark end_mark;
  fy_mark *end_markp_local;
  fy_token_type next_type_local;
  fy_simple_key_mark *fyskm_local;
  fy_parser *fyp_local;
  
  end_mark._8_8_ = end_markp;
  if (end_markp == (fy_mark *)0x0) {
    fy_get_mark(fyp,(fy_mark *)local_38);
    end_mark._8_8_ = local_38;
  }
  end_mark_00 = end_mark._8_8_;
  fyt = fy_token_list_last(&fyp->queued_tokens);
  iVar1 = fy_save_simple_key(fyp,&fyskm->mark,(fy_mark *)end_mark_00,fyt,
                             (_Bool)(fyskm->required & 1),fyskm->flow_level,next_type);
  return iVar1;
}

Assistant:

int fy_save_simple_key_mark(struct fy_parser *fyp,
                            struct fy_simple_key_mark *fyskm,
                            enum fy_token_type next_type,
                            struct fy_mark *end_markp) {
    struct fy_mark end_mark;

    if (!end_markp) {
        fy_get_mark(fyp, &end_mark);
        end_markp = &end_mark;
    }

    return fy_save_simple_key(fyp, &fyskm->mark, end_markp,
                              fy_token_list_last(&fyp->queued_tokens),
                              fyskm->required, fyskm->flow_level,
                              next_type);
}